

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O3

int __thiscall smf::Binasc::processVlvWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  byte bVar1;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined8 in_RAX;
  long lVar6;
  ostream *poVar7;
  uchar byte [5];
  undefined8 uStack_28;
  
  if ((word->_M_string_length < 2) ||
     (pcVar2 = (word->_M_dataplus)._M_p, 9 < (int)pcVar2[1] - 0x30U)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line: ",0xf);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,": \'v\' needs to be followed immediately by a decimal digit",0x39);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    iVar5 = 0;
  }
  else {
    uStack_28 = in_RAX;
    uVar4 = atoi(pcVar2 + 1);
    uStack_28 = CONCAT17((char)uVar4,
                         CONCAT16((char)(uVar4 >> 7),
                                  CONCAT15((char)(uVar4 >> 0xe),
                                           CONCAT14((char)(uVar4 >> 0x15),
                                                    CONCAT13((char)((int)uVar4 >> 0x1c),
                                                             (undefined3)uStack_28))))) &
                0x7f7f7f7f7fffffff;
    lVar6 = 0;
    bVar3 = false;
    do {
      bVar1 = *(byte *)((long)&uStack_28 + lVar6 + 3);
      if (bVar1 != 0) {
        bVar3 = true;
      }
      if (bVar3) {
        *(byte *)((long)&uStack_28 + lVar6 + 3) = bVar1 | 0x80;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    lVar6 = -5;
    do {
      if (lVar6 == -1 || (char)(&stack0xffffffffffffffe0)[lVar6] < '\0') {
        uStack_28._0_3_ = CONCAT12((&stack0xffffffffffffffe0)[lVar6],(undefined2)uStack_28);
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_28 + 2),1);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int Binasc::processVlvWord(std::ostream& out, const std::string& word,
		int lineNum) {
	if (word.size() < 2) {
		std::cerr << "Error on line: " << lineNum
			  << ": 'v' needs to be followed immediately by a decimal digit"
			  << std::endl;
		return 0;
	}
	if (!isdigit(word[1])) {
		std::cerr << "Error on line: " << lineNum
			  << ": 'v' needs to be followed immediately by a decimal digit"
			  << std::endl;
		return 0;
	}
	ulong value = atoi(&word[1]);

	uchar byte[5];
	byte[0] = (value >> 28) & 0x7f;
	byte[1] = (value >> 21) & 0x7f;
	byte[2] = (value >> 14) & 0x7f;
	byte[3] = (value >>  7) & 0x7f;
	byte[4] = (value >>  0) & 0x7f;

	int i;
	int flag = 0;
	for (i=0; i<4; i++) {
		if (byte[i] != 0) {
			flag = 1;
		}
		if (flag) {
			byte[i] |= 0x80;
		}
	}

	for (i=0; i<5; i++) {
		if (byte[i] >= 0x80 || i == 4) {
			out << byte[i];
		}
	}

	return 1;
}